

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_wconv
                   (char_t *s,char_t end_quote)

{
  char_t *pcVar1;
  byte in_SIL;
  byte *in_RDI;
  char_t ss;
  gap g;
  undefined7 in_stack_ffffffffffffffd0;
  byte bVar2;
  gap *in_stack_ffffffffffffffd8;
  gap *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  byte *local_10;
  
  gap::gap((gap *)&stack0xffffffffffffffd8);
  local_10 = in_RDI;
  do {
    while (bVar2 = *local_10, ((anonymous_namespace)::chartype_table[bVar2] & 4) != 0) {
LAB_00edbdda:
      if (*local_10 == in_SIL) {
        pcVar1 = gap::flush(in_stack_ffffffffffffffd8,
                            (char_t *)CONCAT17(bVar2,in_stack_ffffffffffffffd0));
        *pcVar1 = '\0';
        return (char_t *)(local_10 + 1);
      }
      if (((anonymous_namespace)::chartype_table[*local_10] & 8) == 0) {
        if (*local_10 == 0x26) {
          local_10 = (byte *)strconv_escape((char_t *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8),
                                            in_stack_ffffffffffffffe0);
        }
        else {
          if (*local_10 == 0) {
            return (char_t *)0x0;
          }
          local_10 = local_10 + 1;
        }
      }
      else {
        if (*local_10 == 0xd) {
          *local_10 = 0x20;
          if (local_10[1] == 10) {
            gap::push(in_stack_ffffffffffffffe0,&in_stack_ffffffffffffffd8->end,
                      CONCAT17(bVar2,in_stack_ffffffffffffffd0));
          }
        }
        else {
          *local_10 = 0x20;
        }
        local_10 = local_10 + 1;
      }
    }
    bVar2 = local_10[1];
    if (((anonymous_namespace)::chartype_table[bVar2] & 4) != 0) {
      local_10 = local_10 + 1;
      goto LAB_00edbdda;
    }
    bVar2 = local_10[2];
    if (((anonymous_namespace)::chartype_table[bVar2] & 4) != 0) {
      local_10 = local_10 + 2;
      goto LAB_00edbdda;
    }
    bVar2 = local_10[3];
    if (((anonymous_namespace)::chartype_table[bVar2] & 4) != 0) {
      local_10 = local_10 + 3;
      goto LAB_00edbdda;
    }
    local_10 = local_10 + 4;
  } while( true );
}

Assistant:

static char_t* parse_wconv(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_attr_ws));

				if (*s == end_quote)
				{
					*g.flush(s) = 0;

					return s + 1;
				}
				else if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
				{
					if (*s == '\r')
					{
						*s++ = ' ';

						if (*s == '\n') g.push(s, 1);
					}
					else *s++ = ' ';
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return NULL;
				}
				else ++s;
			}
		}